

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O2

void __thiscall
delta_complex_cell_t::compute_boundary
          (delta_complex_cell_t *this,delta_complex_t *complex,size_t thread,
          vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
          *new_cell_cofaces)

{
  pointer pvVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  bool bVar5;
  pointer plVar6;
  index_t iVar7;
  ulong uVar8;
  pointer plVar9;
  long lVar10;
  vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *this_00;
  ulong uVar11;
  ulong uVar12;
  int k;
  ulong uVar13;
  ulong local_130;
  vector<long,_std::allocator<long>_> temp;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  tempOrient;
  _Vector_base<long,_std::allocator<long>_> local_d8;
  long local_c0;
  vector<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
  *local_b8;
  vector<long,_std::allocator<long>_> *local_b0;
  _Vector_base<long,_std::allocator<long>_> local_a8;
  _Vector_base<long,_std::allocator<long>_> local_90;
  _Vector_base<long,_std::allocator<long>_> local_78;
  _Vector_base<long,_std::allocator<long>_> local_60;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  local_48;
  
  local_b0 = &this->boundary;
  uVar11 = 0;
  local_c0 = thread * 0x18;
  local_b8 = new_cell_cofaces;
  do {
    plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ulong)((long)plVar9 - (long)plVar6 >> 3) <= uVar11) {
      return;
    }
    temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    temp.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tempOrient.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tempOrient.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tempOrient.
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar8 = 1;
    if (1 < (uint)uVar11) {
      uVar8 = uVar11;
    }
    for (uVar12 = 0; uVar12 < (ulong)((long)plVar9 - (long)plVar6 >> 3); uVar12 = uVar12 + 1) {
      if (uVar12 != uVar11) {
        std::vector<long,_std::allocator<long>_>::push_back(&temp,plVar6 + uVar12);
        if (uVar12 == 0 || uVar11 <= uVar12) {
          if ((uVar8 & 0xffffffff) < uVar12) {
            local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
            ::emplace_back<std::vector<long,std::allocator<long>>>
                      ((vector<std::vector<long,std::allocator<long>>,std::allocator<std::vector<long,std::allocator<long>>>>
                        *)&tempOrient,(vector<long,_std::allocator<long>_> *)&local_d8);
            std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_d8);
            lVar10 = 0;
            for (uVar13 = 0;
                pvVar1 = (this->orientation).
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                lVar2 = *(long *)&pvVar1[uVar12 - 1].super__Vector_base<long,_std::allocator<long>_>
                                  ._M_impl.super__Vector_impl_data,
                uVar13 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar1[uVar12 - 1].
                                                super__Vector_base<long,_std::allocator<long>_>.
                                                _M_impl.super__Vector_impl_data + 8) - lVar2 >> 3);
                uVar13 = uVar13 + 1) {
              if (uVar11 != uVar13) {
                std::vector<long,_std::allocator<long>_>::push_back
                          (tempOrient.
                           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,
                           (value_type_conflict4 *)(lVar2 + lVar10));
              }
              lVar10 = lVar10 + 8;
            }
          }
        }
        else {
          std::
          vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
          ::push_back(&tempOrient,
                      (this->orientation).
                      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + (uVar12 - 1));
        }
      }
      plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    local_130 = 0;
    bVar5 = false;
    while (bVar5 == false) {
      plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_start;
      pvVar3 = (complex->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)&local_78,&temp);
      iVar7 = delta_complex_t::get_clique(complex,(vector<long,_std::allocator<long>_> *)&local_78);
      lVar10 = *(long *)&pvVar3[((ulong)((long)plVar6 - (long)plVar9) >> 3) - 2].
                         super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                         super__Vector_impl_data;
      lVar2 = *(long *)(lVar10 + 8 + iVar7 * 0x70);
      lVar10 = *(long *)(lVar10 + iVar7 * 0x70);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_78);
      if ((ulong)(lVar2 - lVar10 >> 3) <= local_130) break;
      uVar8 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 3;
      pvVar4 = (complex->cells).
               super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (complex->cliques).
               super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)&local_90,&temp);
      iVar7 = delta_complex_t::get_clique(complex,(vector<long,_std::allocator<long>_> *)&local_90);
      lVar10 = *(long *)(*(long *)(*(long *)&pvVar3[uVar8 - 2].
                                             super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                             ._M_impl + iVar7 * 0x70) + local_130 * 8);
      lVar2 = *(long *)&pvVar4[uVar8 - 2].
                        super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
      ;
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector(&local_48,&tempOrient);
      bVar5 = std::operator==((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               *)(lVar2 + lVar10 * 0xe8 + 0x48),&local_48);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector(&local_48);
      std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_90);
      if (bVar5) {
        uVar8 = (ulong)((long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->vertices).super__Vector_base<long,_std::allocator<long>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3;
        pvVar4 = (complex->cells).
                 super__Vector_base<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 = (complex->cliques).
                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_a8,&temp);
        iVar7 = delta_complex_t::get_clique
                          (complex,(vector<long,_std::allocator<long>_> *)&local_a8);
        std::vector<long,_std::allocator<long>_>::push_back
                  (local_b0,(value_type_conflict4 *)
                            (*(long *)&pvVar4[uVar8 - 2].
                                       super__Vector_base<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>
                             + *(long *)(*(long *)(*(long *)&pvVar3[uVar8 - 2].
                                                                                                                          
                                                  super__Vector_base<clique_t,_std::allocator<clique_t>_>
                                                  ._M_impl + iVar7 * 0x70) + local_130 * 8) * 0xe8 +
                            0x60));
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_a8);
        this_00 = (vector<std::pair<long,long>,std::allocator<std::pair<long,long>>> *)
                  ((long)&(((local_b8->
                            super__Vector_base<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>,_std::allocator<std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                          )._M_impl.super__Vector_impl_data + local_c0);
        plVar6 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        plVar9 = (this->vertices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar3 = (complex->cliques).
                 super__Vector_base<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<long,_std::allocator<long>_>::vector
                  ((vector<long,_std::allocator<long>_> *)&local_60,&temp);
        iVar7 = delta_complex_t::get_clique
                          (complex,(vector<long,_std::allocator<long>_> *)&local_60);
        local_d8._M_impl.super__Vector_impl_data._M_start =
             *(pointer *)
              (*(long *)(*(long *)&pvVar3[((ulong)((long)plVar6 - (long)plVar9) >> 3) - 2].
                                   super__Vector_base<clique_t,_std::allocator<clique_t>_>._M_impl.
                                   super__Vector_impl_data + iVar7 * 0x70) + local_130 * 8);
        local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)this->location;
        std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
        emplace_back<std::pair<long,long>>(this_00,(pair<long,_long> *)&local_d8);
        std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_60);
      }
      local_130 = local_130 + 1;
    }
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector(&tempOrient);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              (&temp.super__Vector_base<long,_std::allocator<long>_>);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void delta_complex_cell_t::compute_boundary(delta_complex_t* complex, size_t thread, std::vector<std::vector<std::pair<index_t, index_t>>>& new_cell_cofaces){
	//For each vertex delete it from the face, by removing it from the vertex set and
	//the relevant rows and columns of the orientation matrix
	//find this face in the complex and add its index to the boundary of the cell,
	//also add this cell to the coboundary of the found cell
	for(int i = 0; i < vertices.size(); i++){
		std::vector<index_t> temp;
		std::vector<std::vector<index_t>> tempOrient;
		for(int j = 0; j < vertices.size(); j++){
			if(j != i){
				temp.push_back(vertices[j]);
				if(j < i && j > 0){ tempOrient.push_back(orientation[j-1]);
				} else if(j > i && j > 1){
					tempOrient.push_back(std::vector<index_t>());
					for(int k = 0; k < orientation[j-1].size(); k++){
						if(k != i){
							tempOrient.back().push_back(orientation[j-1][k]);
						}
					}
				}
			}
		}
        bool found = false;
        int f = 0;
        while(!found && f < complex->cliques[dimension()-1][complex->get_clique(temp)].faces.size()){
			if(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].same_orientation(tempOrient)){
				boundary.push_back(complex->cells[dimension()-1][complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f]].location);
                new_cell_cofaces[thread].push_back(std::make_pair(complex->cliques[dimension()-1][complex->get_clique(temp)].faces[f],location));
				found = true;
			}
            f++;
		}
	}
}